

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-format.hh
# Opt level: O0

optional<tinyusdz::value::TimeSamples> * __thiscall
tinyusdz::crate::CrateValue::get_value<tinyusdz::value::TimeSamples>
          (optional<tinyusdz::value::TimeSamples> *__return_storage_ptr__,CrateValue *this)

{
  optional<tinyusdz::value::TimeSamples> local_40;
  CrateValue *local_18;
  CrateValue *this_local;
  
  local_18 = this;
  this_local = (CrateValue *)__return_storage_ptr__;
  tinyusdz::value::Value::get_value<tinyusdz::value::TimeSamples>(&local_40,&this->value_,false);
  nonstd::optional_lite::optional<tinyusdz::value::TimeSamples>::
  optional<tinyusdz::value::TimeSamples,_0>(__return_storage_ptr__,&local_40);
  nonstd::optional_lite::optional<tinyusdz::value::TimeSamples>::~optional(&local_40);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return value_.get_value<T>();
  }